

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O2

int __thiscall
TPZStructMatrix::ComputeElementColors(TPZStructMatrix *this,TPZVec<int> *elementcolors)

{
  long lVar1;
  int64_t i;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  int inod;
  long lVar6;
  long lVar7;
  int iVar8;
  long j;
  int64_t el;
  long lVar9;
  int local_104;
  long local_f0;
  TPZVec<long> elgraphindex;
  TPZGenMatrix<long> domain;
  TPZStack<long,_10> elgraph;
  
  TPZStack<long,_10>::TPZStack(&elgraph);
  elgraphindex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  elgraphindex.fNAlloc = 0;
  elgraphindex.fStore = (long *)0x0;
  elgraphindex.fNElements = 0;
  if ((this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    TPZCompMesh::ComputeElGraph(this->fMesh,&elgraph,&elgraphindex);
  }
  else {
    TPZCompMesh::ComputeElGraph(this->fMesh,&elgraph,&elgraphindex,&this->fMaterialIds);
  }
  TPZGenMatrix<long>::TPZGenMatrix
            (&domain,(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,10);
  lVar7 = elgraphindex.fNElements + -1;
  (*elementcolors->_vptr_TPZVec[4])(elementcolors);
  local_f0 = CONCAT44(local_f0._4_4_,0xffffffff);
  TPZVec<int>::Fill(elementcolors,(int *)&local_f0,0,-1);
  iVar4 = 0;
  if (lVar7 < 1) {
    lVar7 = 0;
  }
  bVar3 = true;
  local_104 = 0;
  do {
    if (!bVar3) {
      TPZGenMatrix<long>::~TPZGenMatrix(&domain);
      TPZVec<long>::~TPZVec(&elgraphindex);
      TPZManVector<long,_10>::~TPZManVector(&elgraph.super_TPZManVector<long,_10>);
      return local_104;
    }
    bVar3 = false;
    for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
      bVar2 = 0;
      for (j = 0; j != 10; j = j + 1) {
        lVar6 = (long)(int)elgraphindex.fStore[lVar9];
        lVar1 = elgraphindex.fStore[lVar9 + 1];
        while( true ) {
          if (lVar1 <= lVar6) {
            iVar8 = (int)j + iVar4;
            elementcolors->fStore[lVar9] = iVar8;
            if (iVar8 <= local_104) {
              iVar8 = local_104;
            }
            goto LAB_011a0bfb;
          }
          i = elgraph.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar6];
          plVar5 = TPZGenMatrix<long>::operator()(&domain,i,j);
          if (*plVar5 != 0) break;
          plVar5 = TPZGenMatrix<long>::operator()(&domain,i,j);
          *plVar5 = 1;
          lVar6 = lVar6 + 1;
        }
        bVar2 = 1;
      }
      bVar3 = (bool)(bVar2 | bVar3);
      iVar8 = local_104;
LAB_011a0bfb:
      local_104 = iVar8;
    }
    local_f0 = 0;
    TPZGenMatrix<long>::Fill(&domain,&local_f0);
    iVar4 = iVar4 + 10;
  } while( true );
}

Assistant:

int TPZStructMatrix::ComputeElementColors(TPZVec<int> &elementcolors)
{
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    if(!fMaterialIds.size())
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex);
    }
    else
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex, fMaterialIds);
    }
    int64_t nconnects = fMesh->NConnects();
    const int color_stored = 10;
    TPZGenMatrix<int64_t> domain(nconnects,color_stored);
    int64_t nel = elgraphindex.size()-1;
    elementcolors.resize(nel);
    elementcolors.Fill(-1);
    bool element_not_colored = true;
    int highest_color = 0;
    int min_color = 0;
    int max_color = min_color+color_stored;
    while(element_not_colored)
    {
        element_not_colored = false;
        for (int64_t el = 0; el<nel; el++) {
            int icolor;
            bool color_found = true;
            for(int icolor = 0; icolor<color_stored; icolor++)
            {
                color_found = true;
                int64_t firstnode = elgraphindex[el];
                int64_t lastnode = elgraphindex[el+1];
                for (int inod = firstnode; inod < lastnode; inod++) {
                    int64_t ic = elgraph[inod];
                    if(domain(ic,icolor) != 0)
                    {
                        color_found = false;
                        break;
                    }
                    domain(ic,icolor) = 1;
                }
                if(color_found == true)
                {
                    elementcolors[el] = min_color+icolor;
                    if(min_color+icolor > highest_color) highest_color = min_color+icolor;
                    break;
                }
            }
            // the element didn't fit any color, the loop will have to be executed again
            if(!color_found) element_not_colored = true;
        }
        min_color += color_stored;
        max_color += color_stored;
        domain.Fill(0);
    }
    return highest_color;
}